

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

int validate_size_scales
              (RESIZE_MODE resize_mode,aom_superres_mode superres_mode,int owidth,int oheight,
              size_params_type *rsz)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char in_DIL;
  int *in_R8;
  int resize_denom;
  size_params_type *in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  int in_stack_ffffffffffffffd4;
  int local_24;
  int local_4;
  
  iVar2 = dimensions_are_ok(in_stack_ffffffffffffffd4,
                            CONCAT13(in_stack_ffffffffffffffd3,
                                     CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)),
                            in_stack_ffffffffffffffc8);
  if (iVar2 == 0) {
    if ((in_ECX * 8 + (in_R8[1] >> 1)) / in_R8[1] < (in_EDX * 8 + (*in_R8 >> 1)) / *in_R8) {
      iVar2 = (in_EDX * 8 + (*in_R8 >> 1)) / *in_R8;
    }
    else {
      iVar2 = (in_ECX * 8 + (in_R8[1] >> 1)) / in_R8[1];
    }
    if ((in_DIL == '\x02') || (in_ESI != 2)) {
      if ((in_DIL == '\x02') && (in_ESI != 2)) {
        bVar1 = *(byte *)(in_R8 + 2);
        *in_R8 = in_EDX;
        in_R8[1] = in_ECX;
        av1_calculate_scaled_size
                  ((int *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                                  CONCAT12(in_stack_ffffffffffffffd2,
                                                           in_stack_ffffffffffffffd0))),
                   &in_stack_ffffffffffffffc8->resize_width,0);
        iVar3 = dimensions_are_ok(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                                 CONCAT12(in_stack_ffffffffffffffd2,
                                                          in_stack_ffffffffffffffd0)),
                                  in_stack_ffffffffffffffc8);
        if ((iVar3 == 0) && (8 < (uint)(0x80 / (ulong)(long)(int)(uint)bVar1))) {
          *in_R8 = in_EDX;
          in_R8[1] = in_ECX;
          av1_calculate_scaled_size
                    ((int *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                                    CONCAT12(in_stack_ffffffffffffffd2,
                                                             in_stack_ffffffffffffffd0))),
                     &in_stack_ffffffffffffffc8->resize_width,0);
        }
      }
      else {
        if ((in_DIL != '\x02') || (local_24 = iVar2, in_ESI != 2)) {
          return 0;
        }
        do {
          if ((int)(uint)*(byte *)(in_R8 + 2) < local_24) {
            local_24 = local_24 + -1;
          }
          else {
            *(char *)(in_R8 + 2) = (char)in_R8[2] + -1;
          }
          *in_R8 = in_EDX;
          in_R8[1] = in_ECX;
          av1_calculate_scaled_size
                    ((int *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                                    CONCAT12(in_stack_ffffffffffffffd2,
                                                             in_stack_ffffffffffffffd0))),
                     &in_stack_ffffffffffffffc8->resize_width,0);
          iVar3 = dimensions_are_ok(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                                   CONCAT12(in_stack_ffffffffffffffd2,
                                                            in_stack_ffffffffffffffd0)),
                                    in_stack_ffffffffffffffc8);
          in_stack_ffffffffffffffd3 = false;
          if ((iVar3 == 0) &&
             (in_stack_ffffffffffffffd2 = true,
             in_stack_ffffffffffffffd3 = in_stack_ffffffffffffffd2, local_24 < 9)) {
            in_stack_ffffffffffffffd2 = 8 < *(byte *)(in_R8 + 2);
            in_stack_ffffffffffffffd3 = in_stack_ffffffffffffffd2;
          }
        } while ((bool)in_stack_ffffffffffffffd3 != false);
        in_stack_ffffffffffffffd3 = 0;
      }
    }
    else {
      *(char *)(in_R8 + 2) = (char)(0x80 / (long)iVar2);
      iVar3 = dimensions_are_ok(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                               CONCAT12(in_stack_ffffffffffffffd2,
                                                        in_stack_ffffffffffffffd0)),
                                in_stack_ffffffffffffffc8);
      if ((iVar3 == 0) && (8 < *(byte *)(in_R8 + 2))) {
        *(char *)(in_R8 + 2) = (char)in_R8[2] + -1;
      }
    }
    local_4 = dimensions_are_ok(iVar2,CONCAT13(in_stack_ffffffffffffffd3,
                                               CONCAT12(in_stack_ffffffffffffffd2,
                                                        in_stack_ffffffffffffffd0)),
                                in_stack_ffffffffffffffc8);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int validate_size_scales(RESIZE_MODE resize_mode,
                                aom_superres_mode superres_mode, int owidth,
                                int oheight, size_params_type *rsz) {
  if (dimensions_are_ok(owidth, oheight, rsz)) {  // Nothing to do.
    return 1;
  }

  // Calculate current resize scale.
  int resize_denom =
      AOMMAX(DIVIDE_AND_ROUND(owidth * SCALE_NUMERATOR, rsz->resize_width),
             DIVIDE_AND_ROUND(oheight * SCALE_NUMERATOR, rsz->resize_height));

  if (resize_mode != RESIZE_RANDOM && superres_mode == AOM_SUPERRES_RANDOM) {
    // Alter superres scale as needed to enforce conformity.
    rsz->superres_denom =
        (2 * SCALE_NUMERATOR * SCALE_NUMERATOR) / resize_denom;
    if (!dimensions_are_ok(owidth, oheight, rsz)) {
      if (rsz->superres_denom > SCALE_NUMERATOR) --rsz->superres_denom;
    }
  } else if (resize_mode == RESIZE_RANDOM &&
             superres_mode != AOM_SUPERRES_RANDOM) {
    // Alter resize scale as needed to enforce conformity.
    resize_denom =
        (2 * SCALE_NUMERATOR * SCALE_NUMERATOR) / rsz->superres_denom;
    rsz->resize_width = owidth;
    rsz->resize_height = oheight;
    av1_calculate_scaled_size(&rsz->resize_width, &rsz->resize_height,
                              resize_denom);
    if (!dimensions_are_ok(owidth, oheight, rsz)) {
      if (resize_denom > SCALE_NUMERATOR) {
        --resize_denom;
        rsz->resize_width = owidth;
        rsz->resize_height = oheight;
        av1_calculate_scaled_size(&rsz->resize_width, &rsz->resize_height,
                                  resize_denom);
      }
    }
  } else if (resize_mode == RESIZE_RANDOM &&
             superres_mode == AOM_SUPERRES_RANDOM) {
    // Alter both resize and superres scales as needed to enforce conformity.
    do {
      if (resize_denom > rsz->superres_denom)
        --resize_denom;
      else
        --rsz->superres_denom;
      rsz->resize_width = owidth;
      rsz->resize_height = oheight;
      av1_calculate_scaled_size(&rsz->resize_width, &rsz->resize_height,
                                resize_denom);
    } while (!dimensions_are_ok(owidth, oheight, rsz) &&
             (resize_denom > SCALE_NUMERATOR ||
              rsz->superres_denom > SCALE_NUMERATOR));
  } else {  // We are allowed to alter neither resize scale nor superres
            // scale.
    return 0;
  }
  return dimensions_are_ok(owidth, oheight, rsz);
}